

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

Result * __thiscall
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::resolve
          (Result *__return_storage_ptr__,ShaderSubgroupSupportHelper *this)

{
  Feature *pFVar1;
  __node_base _Var2;
  long lVar3;
  Feature feature;
  Candidate *pCVar4;
  Feature *pFVar5;
  CandidateVector candidates;
  FeatureVector deps;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  unique_candidates;
  CandidateVector local_120;
  FeatureVector local_e0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  CandidateVector local_70;
  
  __return_storage_ptr__->weights[4] = 0;
  __return_storage_ptr__->weights[5] = 0;
  __return_storage_ptr__->weights[6] = 0;
  __return_storage_ptr__->weights[7] = 0;
  __return_storage_ptr__->weights[8] = 0;
  __return_storage_ptr__->weights[9] = 0;
  __return_storage_ptr__->weights[0] = 0x1c;
  __return_storage_ptr__->weights[1] = 0x1c;
  __return_storage_ptr__->weights[2] = 0x1c;
  __return_storage_ptr__->weights[3] = 0x1c;
  feature = SubgroupMask;
  do {
    if ((this->feature_mask >> (feature & (FeatureCount|SubgroupID)) & 1) != 0) {
      local_a8._M_buckets = &local_a8._M_single_bucket;
      local_a8._M_bucket_count = 1;
      local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a8._M_element_count = 0;
      local_a8._M_rehash_policy._M_max_load_factor = 1.0;
      local_a8._M_rehash_policy._M_next_resize = 0;
      local_a8._M_single_bucket = (__node_base_ptr)0x0;
      get_candidates_for_feature(&local_120,feature);
      local_70.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.
      ptr = (Candidate *)&local_a8;
      if (local_120.
          super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.
          buffer_size != 0) {
        lVar3 = local_120.
                super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.
                buffer_size << 2;
        pCVar4 = local_120.
                 super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                 .ptr;
        do {
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_a8,pCVar4,&local_70);
          pCVar4 = pCVar4 + 1;
          lVar3 = lVar3 + -4;
        } while (lVar3 != 0);
      }
      get_feature_dependencies(&local_e0,feature);
      _Var2._M_nxt = local_a8._M_before_begin._M_nxt;
      if (local_e0.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
          .buffer_size != 0) {
        pFVar1 = local_e0.
                 super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.
                 ptr + local_e0.
                       super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
                       .buffer_size;
        pFVar5 = local_e0.
                 super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.
                 ptr;
        do {
          get_candidates_for_feature(&local_70,*pFVar5);
          SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
          operator=(&local_120,&local_70);
          local_70.
          super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
               *)local_70.
                 super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                 .ptr != &local_70.stack_storage) {
            free(local_70.
                 super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                 .ptr);
          }
          if (local_120.
              super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.
              buffer_size != 0) {
            lVar3 = local_120.
                    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                    .buffer_size << 2;
            pCVar4 = local_120.
                     super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                     .ptr;
            local_70.
            super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.ptr
                 = (Candidate *)&local_a8;
            do {
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_a8,pCVar4,&local_70);
              pCVar4 = pCVar4 + 1;
              lVar3 = lVar3 + -4;
            } while (lVar3 != 0);
          }
          pFVar5 = pFVar5 + 1;
          _Var2._M_nxt = local_a8._M_before_begin._M_nxt;
        } while (pFVar5 != pFVar1);
      }
      for (; _Var2._M_nxt != (_Hash_node_base *)0x0; _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
        __return_storage_ptr__->weights[*(uint *)&_Var2._M_nxt[1]._M_nxt] =
             __return_storage_ptr__->weights[*(uint *)&_Var2._M_nxt[1]._M_nxt] + 1;
      }
      local_e0.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.
      buffer_size = 0;
      if ((AlignedBuffer<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL> *)
          local_e0.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
          .ptr != &local_e0.stack_storage) {
        free(local_e0.
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.ptr);
      }
      local_120.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.
      buffer_size = 0;
      if ((AlignedBuffer<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL> *)
          local_120.
          super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.ptr !=
          &local_120.stack_storage) {
        free(local_120.
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>.ptr
            );
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a8);
    }
    feature = feature + SubgroupSize;
  } while (feature != FeatureCount);
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::Result CompilerGLSL::ShaderSubgroupSupportHelper::resolve() const
{
	Result res;

	for (uint32_t i = 0u; i < FeatureCount; ++i)
	{
		if (feature_mask & (1u << i))
		{
			auto feature = static_cast<Feature>(i);
			std::unordered_set<uint32_t> unique_candidates;

			auto candidates = get_candidates_for_feature(feature);
			unique_candidates.insert(candidates.begin(), candidates.end());

			auto deps = get_feature_dependencies(feature);
			for (Feature d : deps)
			{
				candidates = get_candidates_for_feature(d);
				if (!candidates.empty())
					unique_candidates.insert(candidates.begin(), candidates.end());
			}

			for (uint32_t c : unique_candidates)
				++res.weights[static_cast<Candidate>(c)];
		}
	}

	return res;
}